

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

int __thiscall ON_Material::AddTexture(ON_Material *this,ON_Texture *tx)

{
  bool bVar1;
  uint uVar2;
  ON_wString *this_00;
  wchar_t *filename;
  
  this_00 = ON_FileReference::FullPath(&tx->m_image_file_reference);
  filename = ON_wString::operator_cast_to_wchar_t_(this_00);
  uVar2 = FindTexture(this,filename,tx->m_type,-1);
  if ((int)uVar2 < 0) {
    uVar2 = (this->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
    ON_ClassArray<ON_Texture>::Append(&(this->m_textures).super_ON_ClassArray<ON_Texture>,tx);
  }
  else {
    ON_Texture::operator=((this->m_textures).super_ON_ClassArray<ON_Texture>.m_a + uVar2,tx);
  }
  bVar1 = ON_UuidIsNil(&(this->m_textures).super_ON_ClassArray<ON_Texture>.m_a[(int)uVar2].
                        m_texture_id);
  if (bVar1) {
    ON_CreateUuid(&(this->m_textures).super_ON_ClassArray<ON_Texture>.m_a[(int)uVar2].m_texture_id);
  }
  return uVar2;
}

Assistant:

int ON_Material::AddTexture( const ON_Texture& tx )
{
  // has to copy user data
  int i = FindTexture( static_cast< const wchar_t* >(tx.m_image_file_reference.FullPath()), tx.m_type );
  if ( i < 0 )
  {
    i = m_textures.Count();
    m_textures.Append(tx);
  }
  else
  {
    m_textures[i] = tx;
  }
  if ( ON_UuidIsNil(m_textures[i].m_texture_id) )
  {
    ON_CreateUuid(m_textures[i].m_texture_id);
  }

  return i;
}